

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O3

void do_cmd_wiz_collect_pit_stats(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t pittype;
  wchar_t depth;
  wchar_t nsim;
  char s [80];
  wchar_t local_74;
  wchar_t local_70;
  wchar_t local_6c;
  char local_68 [88];
  
  _Var1 = stats_are_enabled();
  if (!_Var1) {
    return;
  }
  wVar2 = cmd_get_arg_number((command_conflict *)cmd,"quantity",&local_6c);
  if (wVar2 != L'\0') {
    strnfmt(local_68,0x50,"%d",1000);
    _Var1 = get_string("Number of simulations: ",local_68,0x50);
    if (!_Var1) {
      return;
    }
    _Var1 = get_int_from_string(local_68,&local_6c);
    if (local_6c < L'\x01' || !_Var1) {
      return;
    }
    cmd_set_arg_number((command_conflict *)cmd,"quantity",local_6c);
  }
  wVar2 = cmd_get_arg_choice((command_conflict *)cmd,"choice",&local_74);
  if (wVar2 != L'\0') {
    strnfmt(local_68,0x50,"%d",1);
    _Var1 = get_string("Pit type (1-3): ",local_68,0x50);
    if (!_Var1) {
      return;
    }
    _Var1 = get_int_from_string(local_68,&local_74);
    if (2 < (uint)(local_74 + L'\xffffffff') || !_Var1) {
      return;
    }
    cmd_set_arg_choice((command_conflict *)cmd,"choice",local_74);
  }
  wVar2 = cmd_get_arg_number((command_conflict *)cmd,"depth",&local_70);
  if (wVar2 != L'\0') {
    strnfmt(local_68,0x50,"%d",(ulong)(uint)(int)player->depth);
    _Var1 = get_string("Depth: ",local_68,0x50);
    if (!_Var1) {
      return;
    }
    _Var1 = get_int_from_string(local_68,&local_70);
    if (local_70 < L'\x01' || !_Var1) {
      return;
    }
    cmd_set_arg_number((command_conflict *)cmd,"depth",local_70);
  }
  pit_stats(local_6c,local_74,local_70);
  return;
}

Assistant:

void do_cmd_wiz_collect_pit_stats(struct command *cmd)
{
	int nsim, depth, pittype;
	char s[80];

	if (!stats_are_enabled()) return;

	if (cmd_get_arg_number(cmd, "quantity", &nsim) != CMD_OK) {
		/* Set default. */
		strnfmt(s, sizeof(s), "%d", 1000);

		if (!get_string("Number of simulations: ", s, sizeof(s))) return;
		if (!get_int_from_string(s, &nsim) || nsim < 1) return;
		cmd_set_arg_number(cmd, "quantity", nsim);
	}

	if (cmd_get_arg_choice(cmd, "choice", &pittype) != CMD_OK) {
		/* Set default. */
		strnfmt(s, sizeof(s), "%d", 1);

		if (!get_string("Pit type (1-3): ", s, sizeof(s))) return;
		if (!get_int_from_string(s, &pittype) || pittype < 1 ||
			pittype > 3) return;
		cmd_set_arg_choice(cmd, "choice", pittype);
	}

	if (cmd_get_arg_number(cmd, "depth", &depth) != CMD_OK) {
		/* Set default. */
		strnfmt(s, sizeof(s), "%d", player->depth);

		if (!get_string("Depth: ", s, sizeof(s))) return;
		if (!get_int_from_string(s, &depth) || depth < 1) return;
		cmd_set_arg_number(cmd, "depth", depth);
	}

	pit_stats(nsim, pittype, depth);
}